

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainingLayers.cpp
# Opt level: O3

void CoreMLConverter::convertCaffeTrainingLayers(ConvertLayerParameters layerParameters)

{
  int index;
  int iVar1;
  int iVar2;
  string *psVar3;
  long *plVar4;
  Rep *pRVar5;
  Type *pTVar6;
  ostream *poVar7;
  LogMessage *other;
  mapped_type *pmVar8;
  long lVar9;
  void **ppvVar10;
  long lVar11;
  long in_stack_00000008;
  string input;
  int *in_stack_00000048;
  LogFinisher local_89;
  long *local_88 [2];
  long local_78 [2];
  LogMessage local_68;
  
  index = *in_stack_00000048;
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),index);
  iVar1 = *(int *)(in_stack_00000008 + 0x78);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"WARNING: Skipping training related layer \'",0x2a);
  psVar3 = (pTVar6->name_).ptr_;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' of type \'",0xb);
  psVar3 = (pTVar6->type_).ptr_;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'.",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  iVar2 = (pTVar6->bottom_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0 &&
      ((pTVar6->top_).super_RepeatedPtrFieldBase.current_size_ != 0 && index != iVar1 + -1)) {
    if (iVar2 < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_89,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    plVar4 = (long *)((pTVar6->bottom_).super_RepeatedPtrFieldBase.rep_)->elements[0];
    lVar11 = *plVar4;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>((string *)local_88,lVar11,plVar4[1] + lVar11);
    pRVar5 = (pTVar6->top_).super_RepeatedPtrFieldBase.rep_;
    ppvVar10 = pRVar5->elements;
    if (pRVar5 == (Rep *)0x0) {
      ppvVar10 = (void **)0x0;
    }
    lVar11 = (long)(pTVar6->top_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar11 != 0) {
      lVar9 = 0;
      do {
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)input.field_2._8_8_,*(key_type **)((long)ppvVar10 + lVar9));
        std::__cxx11::string::_M_assign((string *)pmVar8);
        lVar9 = lVar9 + 8;
      } while (lVar11 * 8 != lVar9);
    }
    if (local_88[0] != local_78) {
      operator_delete(local_88[0],local_78[0] + 1);
    }
  }
  return;
}

Assistant:

void CoreMLConverter::convertCaffeTrainingLayers(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int numberOfLayers = layerParameters.prototxt.layer_size();
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    
    std::cout<< "WARNING: Skipping training related layer '" << caffeLayer.name() << "' of type '"
    << caffeLayer.type() << "'." << std::endl;
    
    if (layerId != numberOfLayers-1){
        if (caffeLayer.top_size() != 0 && caffeLayer.bottom_size() != 0) {
            std::string input = caffeLayer.bottom(0);
            for (const auto& output: caffeLayer.top()){
                mappingDataBlobNames[output] = input;
            }
        }
    }
}